

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_EOR_zzz(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TCGContext_conflict1 *tcg_ctx;
  undefined1 uVar4;
  undefined1 extraout_AL;
  
  iVar1 = a->rd;
  iVar2 = a->rm;
  iVar3 = a->rn;
  tcg_ctx = s->uc->tcg_ctx;
  uVar4 = sve_access_check_aarch64(s);
  if ((bool)uVar4) {
    tcg_gen_gvec_xor_aarch64
              (tcg_ctx,0,iVar1 * 0x100 + 0xc10,iVar3 * 0x100 + 0xc10,iVar2 * 0x100 + 0xc10,
               s->sve_len,s->sve_len);
    uVar4 = extraout_AL;
  }
  return (_Bool)uVar4;
}

Assistant:

static bool trans_EOR_zzz(DisasContext *s, arg_rrr_esz *a)
{
    return do_vector3_z(s, tcg_gen_gvec_xor, 0, a->rd, a->rn, a->rm);
}